

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-loader.c++
# Opt level: O0

Maybe<capnp::compiler::Module_&> __thiscall
capnp::compiler::ModuleLoader::Impl::loadModule(Impl *this,ReadableDirectory *dir,PathPtr path)

{
  PathPtr path_00;
  iterator iVar1;
  bool bVar2;
  Own<const_kj::ReadableFile,_std::nullptr_t> *pOVar3;
  RefOrVoid<const_kj::ReadableFile> file_00;
  Path *params_3;
  Own<capnp::compiler::ModuleLoader::ModuleImpl,_std::nullptr_t> *__y;
  pointer ppVar4;
  RefOrVoid<capnp::compiler::Module> pMVar5;
  int __flags;
  void *__child_stack;
  String *in_R8;
  __enable_if_t<is_constructible<value_type,_pair<FileKey,_Own<ModuleImpl>_>_&&>::value,_pair<iterator,_bool>_>
  _Var6;
  pair<capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::ModuleLoader::ModuleImpl,_std::nullptr_t>_>
  local_1a0;
  _Node_iterator_base<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>,_true>
  local_158;
  __enable_if_t<is_constructible<value_type,_pair<FileKey,_Own<ModuleImpl>_>_&&>::value,_pair<iterator,_bool>_>
  insertResult;
  ModuleImpl *result;
  Own<capnp::compiler::ModuleLoader::ModuleImpl,_std::nullptr_t> module;
  undefined1 local_120 [8];
  FileKey key;
  Path pathCopy;
  Own<const_kj::ReadableFile,_std::nullptr_t> *file;
  Maybe<kj::Own<const_kj::ReadableFile,_std::nullptr_t>_> local_a8;
  undefined1 local_98 [8];
  OwnOwn<const_kj::ReadableFile,_std::nullptr_t> _file242;
  FileKey local_70;
  _Node_iterator_base<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>,_true>
  local_38;
  iterator iter;
  ReadableDirectory *dir_local;
  Impl *this_local;
  PathPtr path_local;
  
  this_local = (Impl *)path.parts.size_;
  iter.
  super__Node_iterator_base<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>,_true>
             )path.parts.ptr;
  path_00.parts.size_ = (size_t)in_R8;
  path_00.parts.ptr = (String *)this_local;
  path_local.parts.ptr = in_R8;
  path_local.parts.size_ = (size_t)this;
  anon_unknown_0::FileKey::FileKey
            (&local_70,
             (ReadableDirectory *)
             iter.
             super__Node_iterator_base<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>,_true>
             ._M_cur,path_00);
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>,_capnp::compiler::(anonymous_namespace)::FileKeyHash,_std::equal_to<capnp::compiler::(anonymous_namespace)::FileKey>,_std::allocator<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>_>_>
       ::find((unordered_map<capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>,_capnp::compiler::(anonymous_namespace)::FileKeyHash,_std::equal_to<capnp::compiler::(anonymous_namespace)::FileKey>,_std::allocator<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>_>_>
               *)(dir + 5),&local_70);
  _file242.value.ptr =
       (ReadableFile *)
       std::
       unordered_map<capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>,_capnp::compiler::(anonymous_namespace)::FileKeyHash,_std::equal_to<capnp::compiler::(anonymous_namespace)::FileKey>,_std::allocator<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>_>_>
       ::end((unordered_map<capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>,_capnp::compiler::(anonymous_namespace)::FileKeyHash,_std::equal_to<capnp::compiler::(anonymous_namespace)::FileKey>,_std::allocator<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>_>_>
              *)(dir + 5));
  bVar2 = std::__detail::operator==
                    (&local_38,
                     (_Node_iterator_base<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>,_true>
                      *)&_file242.value.ptr);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    __flags = (int)path_local.parts.ptr;
    (**(code **)(*(long *)iter.
                          super__Node_iterator_base<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>,_true>
                          ._M_cur + 0x50))
              (&local_a8,
               iter.
               super__Node_iterator_base<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>,_true>
               ._M_cur,this_local);
    kj::_::readMaybe<kj::ReadableFile_const,decltype(nullptr)>((_ *)local_98,&local_a8);
    kj::Maybe<kj::Own<const_kj::ReadableFile,_std::nullptr_t>_>::~Maybe(&local_a8);
    pOVar3 = kj::_::OwnOwn::operator_cast_to_Own_((OwnOwn *)local_98);
    if (pOVar3 == (Own<const_kj::ReadableFile,_std::nullptr_t> *)0x0) {
      kj::Maybe<capnp::compiler::Module_&>::Maybe((Maybe<capnp::compiler::Module_&> *)this);
    }
    else {
      pOVar3 = kj::_::OwnOwn<const_kj::ReadableFile,_std::nullptr_t>::operator*
                         ((OwnOwn<const_kj::ReadableFile,_std::nullptr_t> *)local_98);
      kj::PathPtr::clone((PathPtr *)&key.lastModified,(__fn *)&this_local,__child_stack,__flags,
                         in_R8);
      iVar1 = iter;
      kj::PathPtr::PathPtr((PathPtr *)&module.ptr,(Path *)&key.lastModified);
      file_00 = kj::Own<const_kj::ReadableFile,_std::nullptr_t>::operator*(pOVar3);
      anon_unknown_0::FileKey::FileKey
                ((FileKey *)local_120,
                 (ReadableDirectory *)
                 iVar1.
                 super__Node_iterator_base<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>,_true>
                 ._M_cur,(PathPtr)stack0xfffffffffffffed0,file_00);
      pOVar3 = kj::mv<kj::Own<kj::ReadableFile_const,decltype(nullptr)>>(pOVar3);
      iVar1 = iter;
      params_3 = kj::mv<kj::Path>((Path *)&key.lastModified);
      kj::
      heap<capnp::compiler::ModuleLoader::ModuleImpl,capnp::compiler::ModuleLoader::Impl&,kj::Own<kj::ReadableFile_const,decltype(nullptr)>,kj::ReadableDirectory_const&,kj::Path>
                ((kj *)&result,(Impl *)dir,pOVar3,
                 (ReadableDirectory *)
                 iVar1.
                 super__Node_iterator_base<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>,_true>
                 ._M_cur,params_3);
      insertResult._8_8_ =
           kj::Own<capnp::compiler::ModuleLoader::ModuleImpl,_std::nullptr_t>::operator*
                     ((Own<capnp::compiler::ModuleLoader::ModuleImpl,_std::nullptr_t> *)&result);
      __y = kj::mv<kj::Own<capnp::compiler::ModuleLoader::ModuleImpl,decltype(nullptr)>>
                      ((Own<capnp::compiler::ModuleLoader::ModuleImpl,_std::nullptr_t> *)&result);
      std::
      make_pair<capnp::compiler::(anonymous_namespace)::FileKey&,kj::Own<capnp::compiler::ModuleLoader::ModuleImpl,decltype(nullptr)>>
                (&local_1a0,(FileKey *)local_120,__y);
      _Var6 = std::
              unordered_map<capnp::compiler::(anonymous_namespace)::FileKey,kj::Own<capnp::compiler::Module,decltype(nullptr)>,capnp::compiler::(anonymous_namespace)::FileKeyHash,std::equal_to<capnp::compiler::(anonymous_namespace)::FileKey>,std::allocator<std::pair<capnp::compiler::(anonymous_namespace)::FileKey_const,kj::Own<capnp::compiler::Module,decltype(nullptr)>>>>
              ::
              insert<std::pair<capnp::compiler::(anonymous_namespace)::FileKey,kj::Own<capnp::compiler::ModuleLoader::ModuleImpl,decltype(nullptr)>>>
                        ((unordered_map<capnp::compiler::(anonymous_namespace)::FileKey,kj::Own<capnp::compiler::Module,decltype(nullptr)>,capnp::compiler::(anonymous_namespace)::FileKeyHash,std::equal_to<capnp::compiler::(anonymous_namespace)::FileKey>,std::allocator<std::pair<capnp::compiler::(anonymous_namespace)::FileKey_const,kj::Own<capnp::compiler::Module,decltype(nullptr)>>>>
                          *)(dir + 5),&local_1a0);
      local_158._M_cur =
           (__node_type *)
           _Var6.first.
           super__Node_iterator_base<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>,_true>
           ._M_cur;
      insertResult.first.
      super__Node_iterator_base<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>,_true>
      ._M_cur._0_1_ = _Var6.second;
      std::
      pair<capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::ModuleLoader::ModuleImpl,_std::nullptr_t>_>
      ::~pair(&local_1a0);
      if (((byte)insertResult.first.
                 super__Node_iterator_base<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>,_true>
                 ._M_cur & 1) == 0) {
        ppVar4 = std::__detail::
                 _Node_iterator<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>,_false,_true>
                 ::operator->((_Node_iterator<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>,_false,_true>
                               *)&local_158);
        pMVar5 = kj::Own<capnp::compiler::Module,_std::nullptr_t>::operator*(&ppVar4->second);
        kj::Maybe<capnp::compiler::Module_&>::Maybe((Maybe<capnp::compiler::Module_&> *)this,pMVar5)
        ;
      }
      else {
        kj::Maybe<capnp::compiler::Module_&>::Maybe
                  ((Maybe<capnp::compiler::Module_&> *)this,(Module *)insertResult._8_8_);
      }
      kj::Own<capnp::compiler::ModuleLoader::ModuleImpl,_std::nullptr_t>::~Own
                ((Own<capnp::compiler::ModuleLoader::ModuleImpl,_std::nullptr_t> *)&result);
      kj::Path::~Path((Path *)&key.lastModified);
    }
    kj::_::OwnOwn<const_kj::ReadableFile,_std::nullptr_t>::~OwnOwn
              ((OwnOwn<const_kj::ReadableFile,_std::nullptr_t> *)local_98);
  }
  else {
    ppVar4 = std::__detail::
             _Node_iterator<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>,_false,_true>
                           *)&local_38);
    pMVar5 = kj::Own<capnp::compiler::Module,_std::nullptr_t>::operator*(&ppVar4->second);
    kj::Maybe<capnp::compiler::Module_&>::Maybe((Maybe<capnp::compiler::Module_&> *)this,pMVar5);
  }
  return (Maybe<capnp::compiler::Module_&>)(Module *)this;
}

Assistant:

kj::Maybe<Module&> ModuleLoader::Impl::loadModule(
    const kj::ReadableDirectory& dir, kj::PathPtr path) {
  auto iter = modules.find(FileKey(dir, path));
  if (iter != modules.end()) {
    // Return existing file.
    return *iter->second;
  }

  KJ_IF_SOME(file, dir.tryOpenFile(path)) {
    auto pathCopy = path.clone();
    auto key = FileKey(dir, pathCopy, *file);
    auto module = kj::heap<ModuleImpl>(*this, kj::mv(file), dir, kj::mv(pathCopy));
    auto& result = *module;
    auto insertResult = modules.insert(std::make_pair(key, kj::mv(module)));
    if (insertResult.second) {
      return result;
    } else {
      // Now that we have the file open, we noticed a collision. Return the old file.
      return *insertResult.first->second;
    }
  } else {
    // No such file.
    return kj::none;
  }